

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ConfigDeclarationSyntax::setChild
          (ConfigDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *pSVar2;
  SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *pSVar3;
  SyntaxList<slang::syntax::ConfigRuleSyntax> *pSVar4;
  SyntaxNode *pSVar5;
  logic_error *this_00;
  Token TVar6;
  NamedBlockClauseSyntax *local_178;
  string local_150;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined8 local_78;
  Info *local_70;
  undefined8 local_68;
  Info *local_60;
  undefined8 local_58;
  Info *local_50;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  ConfigDeclarationSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar5 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar5);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (&(this->super_MemberSyntax).attributes,pSVar1);
    break;
  case 1:
    TVar6 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar6._0_8_;
    (this->config).kind = (undefined2)local_28;
    (this->config).field_0x2 = local_28._2_1_;
    (this->config).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->config).rawLen = local_28._4_4_;
    local_20 = TVar6.info;
    (this->config).info = local_20;
    break;
  case 2:
    TVar6 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar6._0_8_;
    (this->name).kind = (undefined2)local_38;
    (this->name).field_0x2 = local_38._2_1_;
    (this->name).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->name).rawLen = local_38._4_4_;
    local_30 = TVar6.info;
    (this->name).info = local_30;
    break;
  case 3:
    TVar6 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar6._0_8_;
    (this->semi1).kind = (undefined2)local_48;
    (this->semi1).field_0x2 = local_48._2_1_;
    (this->semi1).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->semi1).rawLen = local_48._4_4_;
    local_40 = TVar6.info;
    (this->semi1).info = local_40;
    break;
  case 4:
    pSVar5 = TokenOrSyntax::node(&child);
    pSVar2 = SyntaxNode::
             as<slang::syntax::SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax>>
                       (pSVar5);
    SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax>::operator=
              (&this->localparams,pSVar2);
    break;
  case 5:
    TVar6 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_58 = TVar6._0_8_;
    (this->design).kind = (undefined2)local_58;
    (this->design).field_0x2 = local_58._2_1_;
    (this->design).numFlags = (NumericTokenFlags)local_58._3_1_;
    (this->design).rawLen = local_58._4_4_;
    local_50 = TVar6.info;
    (this->design).info = local_50;
    break;
  case 6:
    pSVar5 = TokenOrSyntax::node(&child);
    pSVar3 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::ConfigCellIdentifierSyntax>>
                       (pSVar5);
    SyntaxList<slang::syntax::ConfigCellIdentifierSyntax>::operator=(&this->topCells,pSVar3);
    break;
  case 7:
    TVar6 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_68 = TVar6._0_8_;
    (this->semi2).kind = (undefined2)local_68;
    (this->semi2).field_0x2 = local_68._2_1_;
    (this->semi2).numFlags = (NumericTokenFlags)local_68._3_1_;
    (this->semi2).rawLen = local_68._4_4_;
    local_60 = TVar6.info;
    (this->semi2).info = local_60;
    break;
  case 8:
    pSVar5 = TokenOrSyntax::node(&child);
    pSVar4 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::ConfigRuleSyntax>>(pSVar5);
    SyntaxList<slang::syntax::ConfigRuleSyntax>::operator=(&this->rules,pSVar4);
    break;
  case 9:
    TVar6 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_78 = TVar6._0_8_;
    (this->endconfig).kind = (undefined2)local_78;
    (this->endconfig).field_0x2 = local_78._2_1_;
    (this->endconfig).numFlags = (NumericTokenFlags)local_78._3_1_;
    (this->endconfig).rawLen = local_78._4_4_;
    local_70 = TVar6.info;
    (this->endconfig).info = local_70;
    break;
  case 10:
    pSVar5 = TokenOrSyntax::node(&child);
    if (pSVar5 == (SyntaxNode *)0x0) {
      local_178 = (NamedBlockClauseSyntax *)0x0;
    }
    else {
      pSVar5 = TokenOrSyntax::node(&child);
      local_178 = SyntaxNode::as<slang::syntax::NamedBlockClauseSyntax>(pSVar5);
    }
    this->blockName = local_178;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_119);
    std::operator+(&local_f8,&local_118,":");
    std::__cxx11::to_string(&local_150,0xb51);
    std::operator+(&local_d8,&local_f8,&local_150);
    std::operator+(&local_b8,&local_d8,": ");
    std::operator+(&local_98,&local_b8,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_98);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void ConfigDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: config = child.token(); return;
        case 2: name = child.token(); return;
        case 3: semi1 = child.token(); return;
        case 4: localparams = child.node()->as<SyntaxList<ParameterDeclarationStatementSyntax>>(); return;
        case 5: design = child.token(); return;
        case 6: topCells = child.node()->as<SyntaxList<ConfigCellIdentifierSyntax>>(); return;
        case 7: semi2 = child.token(); return;
        case 8: rules = child.node()->as<SyntaxList<ConfigRuleSyntax>>(); return;
        case 9: endconfig = child.token(); return;
        case 10: blockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}